

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_storage_info.cpp
# Opt level: O0

void duckdb::PragmaStorageInfo::RegisterFunction(BuiltinFunctions *set)

{
  TableFunction *in_stack_00000148;
  BuiltinFunctions *in_stack_00000150;
  allocator_type *in_stack_fffffffffffffd58;
  TableFunction *in_stack_fffffffffffffd60;
  initializer_list<duckdb::LogicalType> in_stack_fffffffffffffd68;
  LogicalTypeId in_stack_fffffffffffffd7f;
  LogicalType *in_stack_fffffffffffffd80;
  undefined1 *local_268;
  undefined1 local_238 [16];
  table_function_init_global_t in_stack_fffffffffffffdd8;
  table_function_bind_t bind;
  table_function_t function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  TableFunction *in_stack_fffffffffffffe00;
  table_function_init_local_t in_stack_fffffffffffffe10;
  allocator local_1e1;
  string local_1e0 [480];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1e0,"pragma_storage_info",&local_1e1);
  LogicalType::LogicalType(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7f);
  bind = (table_function_bind_t)local_238;
  function = (table_function_t)0x1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x141c387);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd58);
  TableFunction::TableFunction
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,function,
             bind,in_stack_fffffffffffffdd8,in_stack_fffffffffffffe10);
  BuiltinFunctions::AddFunction(in_stack_00000150,in_stack_00000148);
  TableFunction::~TableFunction(in_stack_fffffffffffffd60);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x141c417);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x141c421);
  local_268 = &stack0xfffffffffffffde0;
  do {
    local_268 = local_268 + -0x18;
    LogicalType::~LogicalType((LogicalType *)0x141c447);
  } while (local_268 != local_238);
  ::std::__cxx11::string::~string(local_1e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  return;
}

Assistant:

void PragmaStorageInfo::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(TableFunction("pragma_storage_info", {LogicalType::VARCHAR}, PragmaStorageInfoFunction,
	                              PragmaStorageInfoBind, PragmaStorageInfoInit));
}